

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_string_converters.h
# Opt level: O1

string * __thiscall
common::vector_to_string_abi_cxx11_
          (string *__return_storage_ptr__,common *this,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *v)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long *plVar4;
  undefined8 *puVar5;
  ulong uVar6;
  long *plVar7;
  ulong *puVar8;
  uint *puVar9;
  uint uVar10;
  uint uVar11;
  string __str_1;
  string __str;
  long *local_f8;
  undefined8 local_f0;
  long local_e8;
  undefined8 uStack_e0;
  ulong *local_d8;
  long local_d0;
  ulong local_c8 [2];
  ulong *local_b8;
  long local_b0;
  ulong local_a8;
  long lStack_a0;
  long *local_98 [2];
  long local_88 [2];
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  uint *local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"{","");
  puVar9 = *(uint **)this;
  local_38 = *(uint **)(this + 8);
  if (puVar9 != local_38) {
    do {
      uVar1 = *puVar9;
      uVar11 = -uVar1;
      if (0 < (int)uVar1) {
        uVar11 = uVar1;
      }
      uVar10 = 1;
      if (9 < uVar11) {
        uVar6 = (ulong)uVar11;
        uVar2 = 4;
        do {
          uVar10 = uVar2;
          uVar3 = (uint)uVar6;
          if (uVar3 < 100) {
            uVar10 = uVar10 - 2;
            goto LAB_0010326f;
          }
          if (uVar3 < 1000) {
            uVar10 = uVar10 - 1;
            goto LAB_0010326f;
          }
          if (uVar3 < 10000) goto LAB_0010326f;
          uVar6 = uVar6 / 10000;
          uVar2 = uVar10 + 4;
        } while (99999 < uVar3);
        uVar10 = uVar10 + 1;
      }
LAB_0010326f:
      uVar2 = puVar9[1];
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct((ulong)local_98,(char)uVar10 - (char)((int)uVar1 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)(uVar1 >> 0x1f) + (long)local_98[0]),uVar10,uVar11);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)local_98,0,(char *)0x0,0x10b05a);
      plVar7 = plVar4 + 2;
      if ((long *)*plVar4 == plVar7) {
        local_68 = *plVar7;
        lStack_60 = plVar4[3];
        local_78 = &local_68;
      }
      else {
        local_68 = *plVar7;
        local_78 = (long *)*plVar4;
      }
      local_70 = plVar4[1];
      *plVar4 = (long)plVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_78);
      local_b8 = &local_a8;
      puVar8 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar8) {
        local_a8 = *puVar8;
        lStack_a0 = plVar4[3];
      }
      else {
        local_a8 = *puVar8;
        local_b8 = (ulong *)*plVar4;
      }
      local_b0 = plVar4[1];
      *plVar4 = (long)puVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      uVar1 = -uVar2;
      if (0 < (int)uVar2) {
        uVar1 = uVar2;
      }
      uVar11 = 1;
      if (9 < uVar1) {
        uVar6 = (ulong)uVar1;
        uVar10 = 4;
        do {
          uVar11 = uVar10;
          uVar3 = (uint)uVar6;
          if (uVar3 < 100) {
            uVar11 = uVar11 - 2;
            goto LAB_001033cd;
          }
          if (uVar3 < 1000) {
            uVar11 = uVar11 - 1;
            goto LAB_001033cd;
          }
          if (uVar3 < 10000) goto LAB_001033cd;
          uVar6 = uVar6 / 10000;
          uVar10 = uVar11 + 4;
        } while (99999 < uVar3);
        uVar11 = uVar11 + 1;
      }
LAB_001033cd:
      local_d8 = local_c8;
      std::__cxx11::string::_M_construct((ulong)&local_d8,(char)uVar11 - (char)((int)uVar2 >> 0x1f))
      ;
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_d8),uVar11,uVar1);
      uVar6 = 0xf;
      if (local_b8 != &local_a8) {
        uVar6 = local_a8;
      }
      if (uVar6 < (ulong)(local_d0 + local_b0)) {
        uVar6 = 0xf;
        if (local_d8 != local_c8) {
          uVar6 = local_c8[0];
        }
        if (uVar6 < (ulong)(local_d0 + local_b0)) goto LAB_00103455;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_b8);
      }
      else {
LAB_00103455:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_d8);
      }
      local_f8 = &local_e8;
      plVar4 = puVar5 + 2;
      if ((long *)*puVar5 == plVar4) {
        local_e8 = *plVar4;
        uStack_e0 = puVar5[3];
      }
      else {
        local_e8 = *plVar4;
        local_f8 = (long *)*puVar5;
      }
      local_f0 = puVar5[1];
      *puVar5 = plVar4;
      puVar5[1] = 0;
      *(undefined1 *)plVar4 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_f8);
      plVar7 = plVar4 + 2;
      if ((long *)*plVar4 == plVar7) {
        local_48 = *plVar7;
        lStack_40 = plVar4[3];
        local_58 = &local_48;
      }
      else {
        local_48 = *plVar7;
        local_58 = (long *)*plVar4;
      }
      local_50 = plVar4[1];
      *plVar4 = (long)plVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58);
      if (local_58 != &local_48) {
        operator_delete(local_58,local_48 + 1);
      }
      if (local_f8 != &local_e8) {
        operator_delete(local_f8,local_e8 + 1);
      }
      if (local_d8 != local_c8) {
        operator_delete(local_d8,local_c8[0] + 1);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if (local_78 != &local_68) {
        operator_delete(local_78,local_68 + 1);
      }
      if (local_98[0] != local_88) {
        operator_delete(local_98[0],local_88[0] + 1);
      }
      puVar9 = puVar9 + 2;
    } while (puVar9 != local_38);
  }
  if (1 < __return_storage_ptr__->_M_string_length) {
    std::__cxx11::string::pop_back();
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

const std::string vector_to_string(const std::vector<std::pair<int, int>>& v) {
  std::string s("{");
  for (auto e : v) {
    s += "(" + std::to_string(e.first) + "," + std::to_string(e.second) + "),";
  }
  if (s.size() > 1) s.pop_back();
  s += "}";
  return s;
}